

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::~small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this)

{
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDI;
  pointer in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  if (in_RDI->m_dynamic_data != (pointer)0x0) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<double>_>::deallocate
              ((allocator_type *)in_RDI,in_stack_ffffffffffffffe8,0x17d943);
  }
  std::allocator<double>::~allocator((allocator<double> *)0x17d951);
  return;
}

Assistant:

~small_vector()
    {
        clear();

        if (m_dynamic_data)
        {
            atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
        }
    }